

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

CharFieldSource * CharFieldSource::create(vm_val_t *val,vm_val_t *newval)

{
  ushort uVar1;
  uint uVar2;
  CVmObjPageEntry *pCVar3;
  int iVar4;
  CharFieldSource *pCVar5;
  ushort *puVar6;
  
  newval->typ = VM_NIL;
  if ((val->typ == VM_OBJ) &&
     (iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         CVmObjByteArray::metaclass_reg_), iVar4 != 0)) {
    pCVar5 = (CharFieldSource *)operator_new(0x20);
    uVar2 = (val->val).obj;
    pCVar5->_vptr_CharFieldSource = (_func_int **)&PTR__CharFieldSource_0032ce60;
    pCVar3 = G_obj_table_X.pages_[uVar2 >> 0xc];
    pCVar5[1]._vptr_CharFieldSource = (_func_int **)(pCVar3 + (uVar2 & 0xfff));
    pCVar5[2]._vptr_CharFieldSource = (_func_int **)0x0;
    pCVar5[3]._vptr_CharFieldSource =
         (_func_int **)(ulong)**(uint **)((long)&pCVar3[uVar2 & 0xfff].ptr_ + 8);
    return pCVar5;
  }
  puVar6 = (ushort *)vm_val_t::cast_to_string(val,newval);
  pCVar5 = (CharFieldSource *)operator_new(0x18);
  uVar1 = *puVar6;
  pCVar5->_vptr_CharFieldSource = (_func_int **)&PTR__CharFieldSource_0032cec0;
  pCVar5[1]._vptr_CharFieldSource = (_func_int **)(puVar6 + 1);
  pCVar5[2]._vptr_CharFieldSource = (_func_int **)(ulong)uVar1;
  return pCVar5;
}

Assistant:

CharFieldSource *CharFieldSource::create(
    VMG_ const vm_val_t *val, vm_val_t *newval)
{
    /* presume we won't create a new value */
    newval->set_nil();

    /* check to see if it's a ByteArray */
    if (val->typ == VM_OBJ
        && CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        return new CharFieldSourceByteArray(vmg_ val->val.obj);

    /* it's not another acceptable type, so it has to be a string */
    const char *str = val->cast_to_string(vmg_ newval);
    return new CharFieldSourceString(str + VMB_LEN, vmb_get_len(str));
}